

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.cpp
# Opt level: O0

uzoff_t __thiscall IZDeflate::deflate_fast(IZDeflate *this)

{
  uzoff_t uVar1;
  uch *local_38;
  uch *local_30;
  uint local_1c;
  int local_18;
  uint match_length;
  int flush;
  IPos hash_head;
  IZDeflate *this_local;
  
  match_length = 0;
  local_1c = 0;
  this->prev_length = 2;
  while (this->lookahead != 0) {
    if (2 < this->lookahead) {
      this->ins_h = (this->ins_h << 5 ^ (uint)this->window[this->strstart + 2]) & 0x7fff;
      match_length = (uint)this->head[this->ins_h];
      this->prev[this->strstart & 0x7fff] = this->head[this->ins_h];
      this->head[this->ins_h] = (Pos)this->strstart;
    }
    if ((match_length != 0) && (this->strstart - match_length < 0x7efb)) {
      if (this->lookahead < (uint)this->nice_match) {
        this->nice_match = this->lookahead;
      }
      local_1c = longest_match(this,match_length);
      if (this->lookahead < local_1c) {
        local_1c = this->lookahead;
      }
    }
    if (local_1c < 3) {
      local_18 = ct_tally(this,0,(uint)this->window[this->strstart]);
      this->lookahead = this->lookahead - 1;
      this->strstart = this->strstart + 1;
    }
    else {
      local_18 = ct_tally(this,this->strstart - this->match_start,local_1c - 3);
      this->lookahead = this->lookahead - local_1c;
      if ((this->max_lazy_match < local_1c) || (this->lookahead < 3)) {
        this->strstart = local_1c + this->strstart;
        this->ins_h = (uint)this->window[this->strstart];
        this->ins_h = (this->ins_h << 5 ^ (uint)this->window[this->strstart + 1]) & 0x7fff;
      }
      else {
        local_1c = local_1c - 1;
        do {
          this->strstart = this->strstart + 1;
          this->ins_h = (this->ins_h << 5 ^ (uint)this->window[this->strstart + 2]) & 0x7fff;
          match_length = (uint)this->head[this->ins_h];
          this->prev[this->strstart & 0x7fff] = this->head[this->ins_h];
          this->head[this->ins_h] = (Pos)this->strstart;
          local_1c = local_1c + -1;
        } while (local_1c != 0);
        this->strstart = this->strstart + 1;
      }
      local_1c = 0;
    }
    if (local_18 != 0) {
      if (this->block_start < 0) {
        local_30 = (uch *)0x0;
      }
      else {
        local_30 = this->window + (this->block_start & 0xffffffff);
      }
      flush_block(this,(char *)local_30,(ulong)this->strstart - this->block_start,0);
      this->block_start = (ulong)this->strstart;
    }
    if (this->lookahead < 0x106) {
      fill_window(this);
    }
  }
  if (this->block_start < 0) {
    local_38 = (uch *)0x0;
  }
  else {
    local_38 = this->window + (this->block_start & 0xffffffff);
  }
  uVar1 = flush_block(this,(char *)local_38,(ulong)this->strstart - this->block_start,1);
  return uVar1;
}

Assistant:

uzoff_t IZDeflate::deflate_fast()
{
    IPos hash_head = NIL;      /* head of the hash chain */
    int flush;                 /* set if current block must be flushed */
    unsigned match_length = 0; /* length of best match */

    prev_length = MIN_MATCH - 1;
    while (lookahead != 0) {
        /* Insert the string window[strstart .. strstart+2] in the
         * dictionary, and set hash_head to the head of the hash chain:
         */
#    ifndef DEFL_UNDETERM
        if (lookahead >= MIN_MATCH)
#    endif
            INSERT_STRING(strstart, hash_head);

        /* Find the longest match, discarding those <= prev_length.
         * At this point we have always match_length < MIN_MATCH
         */
        if (hash_head != NIL && strstart - hash_head <= MAX_DIST) {
            /* To simplify the code, we prevent matches with the string
             * of window index 0 (in particular we have to avoid a match
             * of the string with itself at the start of the input file).
             */
#    ifndef HUFFMAN_ONLY
#        ifndef DEFL_UNDETERM
            /* Do not look for matches beyond the end of the input.
             * This is necessary to make deflate deterministic.
             */
            if ((unsigned)nice_match > lookahead) nice_match = (int)lookahead;
#        endif
            match_length = longest_match(hash_head);
            /* longest_match() sets match_start */
            if (match_length > lookahead) match_length = lookahead;
#    endif
        }
        if (match_length >= MIN_MATCH) {
            check_match(strstart, match_start, match_length);

            flush = ct_tally(strstart - match_start, match_length - MIN_MATCH);

            lookahead -= match_length;

            /* Insert new strings in the hash table only if the match length
             * is not too large. This saves time but degrades compression.
             */
            if (match_length <= max_insert_length
#    ifndef DEFL_UNDETERM
                && lookahead >= MIN_MATCH
#    endif
            ) {
                match_length--; /* string at strstart already in hash table */
                do {
                    strstart++;
                    INSERT_STRING(strstart, hash_head);
                    /* strstart never exceeds WSIZE-MAX_MATCH, so there are
                     * always MIN_MATCH bytes ahead.
                     */
#    ifdef DEFL_UNDETERM
                    /* If lookahead < MIN_MATCH these bytes are garbage,
                     * but it does not matter since the next lookahead bytes
                     * will be emitted as literals.
                     */
#    endif
                } while (--match_length != 0);
                strstart++;
            } else {
                strstart += match_length;
                match_length = 0;
                ins_h = window[strstart];
                UPDATE_HASH(ins_h, window[strstart + 1]);
#    if MIN_MATCH != 3
                Call UPDATE_HASH() MIN_MATCH - 3 more times
#    endif
            }
        } else {
            /* No match, output a literal byte */
            Tracevv((stderr, "%c", window[strstart]));
            flush = ct_tally(0, window[strstart]);
            lookahead--;
            strstart++;
        }
        if (flush) FLUSH_BLOCK(0), block_start = strstart;

        /* Make sure that we always have enough lookahead, except
         * at the end of the input file. We need MAX_MATCH bytes
         * for the next match, plus MIN_MATCH bytes to insert the
         * string following the next match.
         */
        if (lookahead < MIN_LOOKAHEAD) fill_window();
    }
    return FLUSH_BLOCK(1); /* eof */
}